

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

ktx_error_code_e ktxPrintKTX2InfoTextForMemory(ktx_uint8_t *bytes,ktx_size_t size)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  ktxStream kStack_68;
  
  kVar1 = ktxMemStream_construct_ro(&kStack_68,bytes,size);
  if (kVar1 == KTX_SUCCESS) {
    kVar1 = ktxPrintKTX2InfoTextForStream(&kStack_68);
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoTextForMemory(const ktx_uint8_t* bytes, ktx_size_t size)
{
    KTX_error_code result;
    ktxStream stream;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS)
        result = ktxPrintKTX2InfoTextForStream(&stream);
    return result;
}